

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildSetupFont
               (ImFontAtlas *atlas,ImFont *font,ImFontConfig *font_config,float ascent,float descent
               )

{
  Glyph *__src;
  Glyph *__dest;
  Glyph *ptr;
  
  if (font_config->MergeMode == false) {
    font->ContainerAtlas = atlas;
    font->ConfigData = font_config;
    font->ConfigDataCount = 0;
    font->FontSize = font_config->SizePixels;
    font->Ascent = ascent;
    font->Descent = descent;
    if ((font->Glyphs).Capacity < 0) {
      ptr = (Glyph *)0x0;
      __dest = (Glyph *)ImGui::MemAlloc(0);
      __src = (font->Glyphs).Data;
      if (__src != (Glyph *)0x0) {
        memcpy(__dest,__src,(long)(font->Glyphs).Size * 0x28);
        ptr = (font->Glyphs).Data;
      }
      ImGui::MemFree(ptr);
      (font->Glyphs).Data = __dest;
      (font->Glyphs).Capacity = 0;
    }
    (font->Glyphs).Size = 0;
    font->MetricsTotalSurface = 0;
  }
  font->ConfigDataCount = font->ConfigDataCount + 1;
  return;
}

Assistant:

void ImFontAtlasBuildSetupFont(ImFontAtlas* atlas, ImFont* font, ImFontConfig* font_config, float ascent, float descent)
{
    if (!font_config->MergeMode)
    {
        font->ContainerAtlas = atlas;
        font->ConfigData = font_config;
        font->ConfigDataCount = 0;
        font->FontSize = font_config->SizePixels;
        font->Ascent = ascent;
        font->Descent = descent;
        font->Glyphs.resize(0);
        font->MetricsTotalSurface = 0;
    }
    font->ConfigDataCount++;
}